

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  Table *t;
  byte tag;
  TValue *t_00;
  TValue *io;
  TValue key;
  Value local_28;
  undefined1 local_20;
  
  t_00 = index2value(L,idx);
  tag = 0x30;
  if (t_00->tt_ == 'E') {
    t = (Table *)(t_00->value_).gc;
    if (n - 1U < (ulong)t->asize) {
      tag = *(byte *)((long)t->array + n + 3);
      if ((tag & 0xf) != 0) {
        *(byte *)((L->top).offset + 8) = tag;
        (((L->top).p)->val).value_ = t->array[-n];
      }
    }
    else {
      tag = luaH_getint(t,n,&((L->top).p)->val);
    }
  }
  if ((tag & 0xf) == 0) {
    local_20 = 3;
    local_28.i = n;
    tag = luaV_finishget(L,t_00,(TValue *)&local_28,(L->top).p,tag);
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return (int)(tag & 0xf);
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  lu_byte tag;
  lua_lock(L);
  t = index2value(L, idx);
  luaV_fastgeti(t, n, s2v(L->top.p), tag);
  if (tagisempty(tag)) {
    TValue key;
    setivalue(&key, n);
    tag = luaV_finishget(L, t, &key, L->top.p, tag);
  }
  api_incr_top(L);
  lua_unlock(L);
  return novariant(tag);
}